

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRenderRule * __thiscall
QStyleSheetStyle::renderRule
          (QStyleSheetStyle *this,QObject *obj,QStyleOption *opt,int pseudoElement)

{
  bool bVar1;
  Int IVar2;
  Int IVar3;
  QFlags<QStyle::StateFlag> QVar4;
  Int IVar5;
  QStyleOptionComplex *pQVar6;
  QStyleOptionComboBox *pQVar7;
  QStyleOptionSpinBox *pQVar8;
  QStyleOptionGroupBox *pQVar9;
  QStyleOptionMenuItem *pQVar10;
  QStyleOptionHeader *pQVar11;
  QStyleOptionTabWidgetFrame *pQVar12;
  QStyleOptionTab *pQVar13;
  QStyleOptionButton *pQVar14;
  QStyleOptionFrame *pQVar15;
  QStyleOptionToolBar *pQVar16;
  QStyleOptionToolBox *pQVar17;
  QStyleOptionDockWidget *pQVar18;
  QStyleOptionViewItem *pQVar19;
  QPlainTextEdit *pQVar20;
  QTextEdit *pQVar21;
  QLineEdit *pQVar22;
  QFrame *pQVar23;
  QStyleOption *in_RCX;
  StateFlag other;
  QRenderRule *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QFrame *frm_1;
  QLineEdit *lineEdit;
  QTextEdit *edit_1;
  QPlainTextEdit *edit;
  QStyleOptionViewItem *vopt;
  QStyleOptionDockWidget *dw;
  QStyleOptionToolBox *tb_2;
  QStyleOptionToolBar *tb_1;
  QStyleOptionFrame *frm;
  QStyleOptionButton *btn;
  QStyleOptionTab *tab_1;
  QStyleOptionTabWidgetFrame *tab;
  QStyleOptionHeader *hdr;
  QStyleOptionMenuItem *mi;
  QStyleOptionTitleBar *tb;
  QStyleOptionGroupBox *gb;
  QStyleOptionSpinBox *spin;
  QStyleOptionComboBox *combo;
  bool up;
  bool on;
  QStyleOptionSpinBox *sb;
  SubControl subControl;
  QStyleOptionComplex *complex;
  quint64 extraClass;
  State state;
  FrameFeature in_stack_fffffffffffffe5c;
  QPlainTextEdit *in_stack_fffffffffffffe60;
  enum_type f1;
  QFlagsStorage<QStyle::StateFlag> in_stack_fffffffffffffe68;
  bool local_17a;
  bool local_169;
  QRenderRule *pQVar24;
  QStyleOptionSpinBox *in_stack_ffffffffffffff68;
  QFlagsStorage<QStyle::StateFlag> in_stack_ffffffffffffff74;
  QFlagsStorage<QStyle::StateFlag> in_stack_ffffffffffffff78;
  SubControl in_stack_ffffffffffffff7c;
  QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4> local_40;
  QFlagsStorageHelper<QStyleOptionFrame::FrameFeature,_4> local_3c;
  QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4> local_38;
  QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4> local_34;
  QFlagsStorageHelper<QStyleOptionFrame::FrameFeature,_4> local_30;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_2c;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_28;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_24;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_20;
  QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4> local_1c;
  QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4> local_18;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_14;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_10;
  QFlagsStorage<QStyle::StateFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  pQVar24 = in_RDI;
  if (in_RCX == (QStyleOption *)0x0) {
    QFlags<QStyle::StateFlag>::QFlags
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  }
  else {
    local_c.i = (in_RCX->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i;
  }
  pQVar6 = qstyleoption_cast<QStyleOptionComplex_const*>(in_RCX);
  if (pQVar6 == (QStyleOptionComplex *)0x0) {
    pQVar10 = qstyleoption_cast<QStyleOptionMenuItem_const*>(in_RCX);
    if ((pQVar10 == (QStyleOptionMenuItem *)0x0) &&
       (pQVar11 = qstyleoption_cast<QStyleOptionHeader_const*>(in_RCX),
       pQVar11 == (QStyleOptionHeader *)0x0)) {
      pQVar12 = qstyleoption_cast<QStyleOptionTabWidgetFrame_const*>(in_RCX);
      if (pQVar12 == (QStyleOptionTabWidgetFrame *)0x0) {
        pQVar13 = qstyleoption_cast<QStyleOptionTab_const*>(in_RCX);
        if (pQVar13 == (QStyleOptionTab *)0x0) {
          pQVar14 = qstyleoption_cast<QStyleOptionButton_const*>(in_RCX);
          if (pQVar14 == (QStyleOptionButton *)0x0) {
            pQVar15 = qstyleoption_cast<QStyleOptionFrame_const*>(in_RCX);
            if (pQVar15 == (QStyleOptionFrame *)0x0) {
              pQVar16 = qstyleoption_cast<QStyleOptionToolBar_const*>(in_RCX);
              if (((pQVar16 == (QStyleOptionToolBar *)0x0) &&
                  (pQVar17 = qstyleoption_cast<QStyleOptionToolBox_const*>(in_RCX),
                  pQVar17 == (QStyleOptionToolBox *)0x0)) &&
                 (pQVar18 = qstyleoption_cast<QStyleOptionDockWidget_const*>(in_RCX),
                 pQVar18 == (QStyleOptionDockWidget *)0x0)) {
                pQVar19 = qstyleoption_cast<QStyleOptionViewItem_const*>(in_RCX);
                if (pQVar19 == (QStyleOptionViewItem *)0x0) {
                  pQVar20 = qobject_cast<QPlainTextEdit_const*>((QObject *)0x41feaa);
                  if (pQVar20 == (QPlainTextEdit *)0x0) {
                    pQVar21 = qobject_cast<QTextEdit_const*>((QObject *)0x41ff01);
                    if (pQVar21 != (QTextEdit *)0x0) {
                      QTextEdit::isReadOnly((QTextEdit *)in_stack_fffffffffffffe60);
                    }
                  }
                  else {
                    QPlainTextEdit::isReadOnly(in_stack_fffffffffffffe60);
                  }
                }
                else {
                  local_40.super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
                       (QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>)
                       QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&
                                 ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)
                                  in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
                  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_40);
                }
              }
            }
            else {
              local_3c.super_QFlagsStorage<QStyleOptionFrame::FrameFeature>.i =
                   (QFlagsStorage<QStyleOptionFrame::FrameFeature>)
                   QFlags<QStyleOptionFrame::FrameFeature>::operator&
                             ((QFlags<QStyleOptionFrame::FrameFeature> *)in_stack_fffffffffffffe60,
                              in_stack_fffffffffffffe5c);
              ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
            }
          }
          else {
            local_34.super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i =
                 (QFlagsStorage<QStyleOptionButton::ButtonFeature>)
                 QFlags<QStyleOptionButton::ButtonFeature>::operator&
                           ((QFlags<QStyleOptionButton::ButtonFeature> *)in_stack_fffffffffffffe60,
                            in_stack_fffffffffffffe5c);
            ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
            local_38.super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i =
                 (QFlagsStorage<QStyleOptionButton::ButtonFeature>)
                 QFlags<QStyleOptionButton::ButtonFeature>::operator&
                           ((QFlags<QStyleOptionButton::ButtonFeature> *)in_stack_fffffffffffffe60,
                            in_stack_fffffffffffffe5c);
            ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_38);
          }
        }
        else {
          switch(pQVar13->shape) {
          case RoundedNorth:
          case TriangularNorth:
            break;
          case RoundedSouth:
          case TriangularSouth:
            break;
          case RoundedWest:
          case TriangularWest:
            break;
          case RoundedEast:
          case TriangularEast:
          }
        }
      }
      else {
        switch(pQVar12->shape) {
        case RoundedNorth:
        case TriangularNorth:
          break;
        case RoundedSouth:
        case TriangularSouth:
          break;
        case RoundedWest:
        case TriangularWest:
          break;
        case RoundedEast:
        case TriangularEast:
        }
      }
    }
    pQVar22 = qobject_cast<QLineEdit_const*>((QObject *)0x41ff63);
    if (pQVar22 == (QLineEdit *)0x0) {
      pQVar23 = qobject_cast<QFrame_const*>((QObject *)0x41ffcf);
      if (pQVar23 != (QFrame *)0x0) {
        QFrame::lineWidth((QFrame *)in_stack_fffffffffffffe60);
      }
    }
    else {
      QFlags<QStyle::StateFlag>::operator&=((QFlags<QStyle::StateFlag> *)&local_c,-5);
      QLineEdit::hasFrame((QLineEdit *)in_stack_fffffffffffffe60);
    }
  }
  else {
    if (in_R8D != 0) {
      in_stack_ffffffffffffff7c = knownPseudoElements[in_R8D].subControl;
      local_10.super_QFlagsStorage<QStyle::SubControl>.i =
           (QFlagsStorage<QStyle::SubControl>)
           QFlags<QStyle::SubControl>::operator&
                     ((QFlags<QStyle::SubControl> *)in_stack_fffffffffffffe60,
                      in_stack_fffffffffffffe5c);
      bVar1 = QFlags<QStyle::SubControl>::operator!((QFlags<QStyle::SubControl> *)&local_10);
      if (bVar1) {
        local_14.super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorage<QStyle::StateFlag>)
             ::operator|((enum_type)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                         (enum_type)in_stack_fffffffffffffe60);
        in_stack_ffffffffffffff78.i =
             (Int)QFlags<QStyle::StateFlag>::operator|
                            ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,
                             in_stack_fffffffffffffe5c);
        QFlags<QStyle::StateFlag>::operator&=
                  ((QFlags<QStyle::StateFlag> *)&local_c,
                   (QFlags<QStyle::StateFlag>)in_stack_ffffffffffffff78.i);
      }
    }
    f1 = (enum_type)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    switch(in_R8D) {
    case 8:
    case 9:
      ::operator|(f1,(enum_type)in_stack_fffffffffffffe60);
      in_stack_ffffffffffffff74.i =
           (Int)QFlags<QStyle::StateFlag>::operator&
                          ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,
                           in_stack_fffffffffffffe68.i);
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&local_c,
                 (QFlags<QStyle::StateFlag>)in_stack_ffffffffffffff74.i);
      break;
    default:
      break;
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      in_stack_ffffffffffffff68 = qstyleoption_cast<QStyleOptionSpinBox_const*>(in_RCX);
      if (in_stack_ffffffffffffff68 != (QStyleOptionSpinBox *)0x0) {
        local_169 = in_R8D == 0xb || in_R8D == 0xc;
        local_18.super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i =
             (QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>)
             QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                       ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe5c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
        bVar1 = false;
        if (IVar2 != 0) {
          bVar1 = local_169;
        }
        if (bVar1) {
          bVar1 = true;
        }
        else {
          local_1c.super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i =
               (QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>)
               QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                         ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe5c);
          IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
          bVar1 = IVar2 != 0 && (in_R8D != 0xb && in_R8D != 0xc);
        }
        other = State_Off;
        if (bVar1) {
          other = State_On;
        }
        QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_c,other);
      }
      break;
    case 0xf:
      ::operator|(f1,(enum_type)in_stack_fffffffffffffe60);
      QVar4 = QFlags<QStyle::StateFlag>::operator&
                        ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,
                         (QFlags<QStyle::StateFlag>)in_stack_fffffffffffffe68.i);
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_c,QVar4);
      break;
    case 0x11:
    case 0x12:
    case 0x13:
      QVar4 = QFlags<QStyle::StateFlag>::operator&
                        ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe5c);
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_c,QVar4);
      local_20.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorage<QStyle::StateFlag>)
           QFlags<QStyle::StateFlag>::operator&
                     ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,
                      in_stack_fffffffffffffe5c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
      bVar1 = true;
      if (IVar3 == 0) {
        local_24.super_QFlagsStorage<QStyle::SubControl>.i =
             (QFlagsStorage<QStyle::SubControl>)
             QFlags<QStyle::SubControl>::operator&
                       ((QFlags<QStyle::SubControl> *)in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe5c);
        IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
        bVar1 = IVar5 != 0;
      }
      if (bVar1) {
        QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_c,State_Sunken);
      }
      break;
    case 0x31:
      QVar4 = QFlags<QStyle::StateFlag>::operator&
                        ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe5c);
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_c,QVar4);
    }
    pQVar7 = qstyleoption_cast<QStyleOptionComboBox_const*>(in_RCX);
    if (pQVar7 == (QStyleOptionComboBox *)0x0) {
      pQVar8 = qstyleoption_cast<QStyleOptionSpinBox_const*>(in_RCX);
      if (pQVar8 == (QStyleOptionSpinBox *)0x0) {
        pQVar9 = qstyleoption_cast<QStyleOptionGroupBox_const*>(in_RCX);
        if (pQVar9 == (QStyleOptionGroupBox *)0x0) {
          qstyleoption_cast<QStyleOptionTitleBar_const*>(in_RCX);
        }
        else {
          local_30.super_QFlagsStorage<QStyleOptionFrame::FrameFeature>.i =
               (QFlagsStorage<QStyleOptionFrame::FrameFeature>)
               QFlags<QStyleOptionFrame::FrameFeature>::operator&
                         ((QFlags<QStyleOptionFrame::FrameFeature> *)in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe5c);
          ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
        }
      }
    }
    else {
      local_17a = false;
      if (in_R8D == 0) {
        local_28.super_QFlagsStorage<QStyle::SubControl>.i =
             (QFlagsStorage<QStyle::SubControl>)
             QFlags<QStyle::SubControl>::operator&
                       ((QFlags<QStyle::SubControl> *)in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe5c);
        IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
        local_17a = false;
        if (IVar5 != 0) {
          local_2c.super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorage<QStyle::StateFlag>)
               QFlags<QStyle::StateFlag>::operator&
                         ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe5c);
          local_17a = QFlags<QStyle::StateFlag>::operator!((QFlags<QStyle::StateFlag> *)&local_2c);
        }
      }
      if (local_17a != false) {
        QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_c,State_Sunken);
      }
    }
  }
  pseudoClass((QFlagsStorageHelper<QStyle::StateFlag,_4>)SUB84((ulong)pQVar24 >> 0x20,0));
  renderRule((QStyleSheetStyle *)pQVar24,
             (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78.i),
             in_stack_ffffffffffffff74.i,(quint64)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRenderRule QStyleSheetStyle::renderRule(const QObject *obj, const QStyleOption *opt, int pseudoElement) const
{
    quint64 extraClass = 0;
    QStyle::State state = opt ? opt->state : QStyle::State(QStyle::State_None);

    if (const QStyleOptionComplex *complex = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
        if (pseudoElement != PseudoElement_None) {
            // if not an active subcontrol, just pass enabled/disabled
            QStyle::SubControl subControl = knownPseudoElements[pseudoElement].subControl;

            if (!(complex->activeSubControls & subControl))
                state &= (QStyle::State_Enabled | QStyle::State_Horizontal | QStyle::State_HasFocus);
        }

        switch (pseudoElement) {
        case PseudoElement_ComboBoxDropDown:
        case PseudoElement_ComboBoxArrow:
            state |= (complex->state & (QStyle::State_On|QStyle::State_ReadOnly));
            break;
        case PseudoElement_SpinBoxUpButton:
        case PseudoElement_SpinBoxDownButton:
        case PseudoElement_SpinBoxUpArrow:
        case PseudoElement_SpinBoxDownArrow:
#if QT_CONFIG(spinbox)
            if (const QStyleOptionSpinBox *sb = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
                bool on = false;
                bool up = pseudoElement == PseudoElement_SpinBoxUpButton
                          || pseudoElement == PseudoElement_SpinBoxUpArrow;
                if ((sb->stepEnabled & QAbstractSpinBox::StepUpEnabled) && up)
                    on = true;
                else if ((sb->stepEnabled & QAbstractSpinBox::StepDownEnabled) && !up)
                    on = true;
                state |= (on ? QStyle::State_On : QStyle::State_Off);
            }
#endif // QT_CONFIG(spinbox)
            break;
        case PseudoElement_GroupBoxTitle:
            state |= (complex->state & (QStyle::State_MouseOver | QStyle::State_Sunken));
            break;
        case PseudoElement_ToolButtonMenu:
        case PseudoElement_ToolButtonMenuArrow:
        case PseudoElement_ToolButtonMenuIndicator:
            state |= complex->state & QStyle::State_MouseOver;
            if (complex->state & QStyle::State_Sunken ||
                complex->activeSubControls & QStyle::SC_ToolButtonMenu)
                state |= QStyle::State_Sunken;
            break;
        case PseudoElement_SliderGroove:
            state |= complex->state & QStyle::State_MouseOver;
            break;
        default:
            break;
        }

        if (const QStyleOptionComboBox *combo = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            // QStyle::State_On is set when the popup is being shown
            // Propagate EditField Pressed state
            if (pseudoElement == PseudoElement_None
                && (complex->activeSubControls & QStyle::SC_ComboBoxEditField)
                && (!(state & QStyle::State_MouseOver))) {
                state |= QStyle::State_Sunken;
            }

            if (!combo->frame)
                extraClass |= PseudoClass_Frameless;
            if (!combo->editable)
                extraClass |= PseudoClass_ReadOnly;
            else
                extraClass |= PseudoClass_Editable;
#if QT_CONFIG(spinbox)
        } else if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (!spin->frame)
                extraClass |= PseudoClass_Frameless;
#endif // QT_CONFIG(spinbox)
        } else if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            if (gb->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
            if (gb->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
        } else if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            if (tb->titleBarState & Qt::WindowMinimized) {
                extraClass |= PseudoClass_Minimized;
            }
            else if (tb->titleBarState & Qt::WindowMaximized)
                extraClass |= PseudoClass_Maximized;
        }
    } else {
        // handle simple style options
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            if (mi->menuItemType == QStyleOptionMenuItem::DefaultItem)
                extraClass |= PseudoClass_Default;
            if (mi->checkType == QStyleOptionMenuItem::Exclusive)
                extraClass |= PseudoClass_Exclusive;
            else if (mi->checkType == QStyleOptionMenuItem::NonExclusive)
                extraClass |= PseudoClass_NonExclusive;
            if (mi->checkType != QStyleOptionMenuItem::NotCheckable)
                extraClass |= (mi->checked) ? (PseudoClass_On|PseudoClass_Checked)
                                            : (PseudoClass_Off|PseudoClass_Unchecked);
        } else if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            if (hdr->position == QStyleOptionHeader::OnlyOneSection)
                extraClass |= PseudoClass_OnlyOne;
            else if (hdr->position == QStyleOptionHeader::Beginning)
                extraClass |= PseudoClass_First;
            else if (hdr->position == QStyleOptionHeader::End)
                extraClass |= PseudoClass_Last;
            else if (hdr->position == QStyleOptionHeader::Middle)
                extraClass |= PseudoClass_Middle;

            if (hdr->selectedPosition == QStyleOptionHeader::NextAndPreviousAreSelected)
                extraClass |= (PseudoClass_NextSelected | PseudoClass_PreviousSelected);
            else if (hdr->selectedPosition == QStyleOptionHeader::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (hdr->selectedPosition == QStyleOptionHeader::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
#if QT_CONFIG(tabwidget)
        } else if (const QStyleOptionTabWidgetFrame *tab = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif
#if QT_CONFIG(tabbar)
        } else if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
            if (tab->position == QStyleOptionTab::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tab->position == QStyleOptionTab::Beginning)
                extraClass |= PseudoClass_First;
            else if (tab->position == QStyleOptionTab::End)
                extraClass |= PseudoClass_Last;
            else if (tab->position == QStyleOptionTab::Middle)
                extraClass |= PseudoClass_Middle;

            if (tab->selectedPosition == QStyleOptionTab::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tab->selectedPosition == QStyleOptionTab::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;

            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif // QT_CONFIG(tabbar)
        } else if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::Flat)
                extraClass |= PseudoClass_Flat;
            if (btn->features & QStyleOptionButton::DefaultButton)
                extraClass |= PseudoClass_Default;
        } else if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (frm->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
            if (frm->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
        }
#if QT_CONFIG(toolbar)
        else if (const QStyleOptionToolBar *tb = qstyleoption_cast<const QStyleOptionToolBar *>(opt)) {
            if (tb->toolBarArea == Qt::LeftToolBarArea)
                extraClass |= PseudoClass_Left;
            else if (tb->toolBarArea == Qt::RightToolBarArea)
                extraClass |= PseudoClass_Right;
            else if (tb->toolBarArea == Qt::TopToolBarArea)
                extraClass |= PseudoClass_Top;
            else if (tb->toolBarArea == Qt::BottomToolBarArea)
                extraClass |= PseudoClass_Bottom;

            if (tb->positionWithinLine == QStyleOptionToolBar::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->positionWithinLine == QStyleOptionToolBar::Middle)
                extraClass |= PseudoClass_Middle;
            else if (tb->positionWithinLine == QStyleOptionToolBar::End)
                extraClass |= PseudoClass_Last;
            else if (tb->positionWithinLine == QStyleOptionToolBar::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
        }
#endif // QT_CONFIG(toolbar)
#if QT_CONFIG(toolbox)
        else if (const QStyleOptionToolBox *tb = qstyleoption_cast<const QStyleOptionToolBox *>(opt)) {
            if (tb->position == QStyleOptionToolBox::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tb->position == QStyleOptionToolBox::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->position == QStyleOptionToolBox::End)
                extraClass |= PseudoClass_Last;
            else if (tb->position == QStyleOptionToolBox::Middle)
                extraClass |= PseudoClass_Middle;

            if (tb->selectedPosition == QStyleOptionToolBox::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tb->selectedPosition == QStyleOptionToolBox::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
        }
#endif // QT_CONFIG(toolbox)
#if QT_CONFIG(dockwidget)
        else if (const QStyleOptionDockWidget *dw = qstyleoption_cast<const QStyleOptionDockWidget *>(opt)) {
            if (dw->verticalTitleBar)
                extraClass |= PseudoClass_Vertical;
            else
                extraClass |= PseudoClass_Horizontal;
            if (dw->closable)
                extraClass |= PseudoClass_Closable;
            if (dw->floatable)
                extraClass |= PseudoClass_Floatable;
            if (dw->movable)
                extraClass |= PseudoClass_Movable;
        }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(itemviews)
        else if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            if (vopt->features & QStyleOptionViewItem::Alternate)
                extraClass |= PseudoClass_Alternate;
            if (vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Beginning)
                extraClass |= PseudoClass_First;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::End)
                extraClass |= PseudoClass_Last;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Middle)
                extraClass |= PseudoClass_Middle;

        }
#endif
#if QT_CONFIG(textedit)
        else if (const QPlainTextEdit *edit = qobject_cast<const QPlainTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
        else if (const QTextEdit *edit = qobject_cast<const QTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
#endif
#if QT_CONFIG(lineedit)
        // LineEdit sets Sunken flag to indicate Sunken frame (argh)
        if (const QLineEdit *lineEdit = qobject_cast<const QLineEdit *>(obj)) {
            state &= ~QStyle::State_Sunken;
            if (lineEdit->hasFrame()) {
                extraClass &= ~PseudoClass_Frameless;
            } else {
                extraClass |= PseudoClass_Frameless;
            }
        } else
#endif
        if (const QFrame *frm = qobject_cast<const QFrame *>(obj)) {
            if (frm->lineWidth() == 0)
                extraClass |= PseudoClass_Frameless;
        }
    }

    return renderRule(obj, pseudoElement, pseudoClass(state) | extraClass);
}